

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Yolov3DetectionOutput_x86::forward
          (Yolov3DetectionOutput_x86 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
  *this_00;
  undefined4 uVar2;
  size_t sVar3;
  iterator __position;
  Mat *this_01;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined8 uVar6;
  undefined8 uVar7;
  void *pvVar8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  float *pfVar13;
  undefined4 *puVar14;
  _func_int **pp_Var15;
  int iVar16;
  BBoxRect *__args;
  float *pfVar17;
  _func_int *p_Var18;
  _func_int *p_Var19;
  pointer pMVar20;
  long lVar21;
  long lVar22;
  float *pfVar23;
  ulong uVar24;
  ulong uVar25;
  uint _h;
  float fVar26;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  float fVar31;
  undefined1 auVar30 [16];
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  local_1a8;
  ulong local_188;
  long local_180;
  BBoxRect local_178;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_158;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  ulong local_128;
  float *local_120;
  float *local_118;
  float *local_110;
  float local_108;
  float fStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  float local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_e8;
  Option *local_e0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_d8;
  pointer local_d0;
  long local_c8;
  long local_c0;
  void *local_b8;
  ulong local_b0;
  void *local_a8;
  ulong local_a0;
  long local_98;
  float *local_90;
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_158.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8 = top_blobs;
  local_e0 = opt;
  if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_188 = 0;
    local_d8 = bottom_blobs;
    do {
      pvVar9 = local_d8;
      local_1a8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::resize(&local_1a8,
               (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_Yolov3DetectionOutput_x86[-3]));
      pMVar20 = (pvVar9->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pp_Var15 = this->_vptr_Yolov3DetectionOutput_x86;
      p_Var18 = pp_Var15[-3];
      iVar11 = *(int *)(&this->field_0xd4 + (long)p_Var18);
      iVar10 = pMVar20[local_188].c / iVar11;
      if (iVar10 != *(int *)(&this->field_0xd0 + (long)p_Var18) + 5) {
        std::
        vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ::~vector(&local_1a8);
        iVar11 = -1;
        goto LAB_002b7bb8;
      }
      if (0 < iVar11) {
        pMVar20 = pMVar20 + local_188;
        uVar25._0_4_ = pMVar20->w;
        uVar25._4_4_ = pMVar20->h;
        p_Var19 = (_func_int *)((long)&this->_vptr_Yolov3DetectionOutput_x86 + (long)p_Var18);
        local_68._0_4_ = (float)(int)(undefined4)uVar25;
        local_68._4_4_ = (undefined4)(int)uVar25._4_4_;
        fVar26 = *(float *)(*(long *)(p_Var19 + 0x170) + local_188 * 4);
        local_128 = (ulong)(uint)uVar25._4_4_;
        uVar25 = uVar25 & 0xffffffff;
        local_88._0_4_ = (undefined4)(int)(fVar26 * local_68._0_4_);
        local_88._4_4_ = (undefined4)(int)(fVar26 * (float)local_68._4_4_);
        local_88._8_4_ = (float)(int)(fVar26 * 0.0);
        local_88._12_4_ = (float)(int)(fVar26 * 0.0);
        local_c0 = (long)iVar10;
        register0x000012c8 = 0x3f0000003f000000;
        auVar27 = rcpps(local_88,_local_68);
        local_78 = auVar27._0_4_;
        fStack_74 = auVar27._4_4_;
        fStack_70 = auVar27._8_4_;
        fStack_6c = auVar27._12_4_;
        local_78 = (1.0 - local_68._0_4_ * local_78) * local_78 + local_78;
        fStack_74 = (1.0 - (float)local_68._4_4_ * fStack_74) * fStack_74 + fStack_74;
        fStack_70 = (1.0 - fStack_70 * 0.5) * fStack_70 + fStack_70;
        fStack_6c = (1.0 - fStack_6c * 0.5) * fStack_6c + fStack_6c;
        lVar21 = (long)iVar11 * local_188 * 4;
        local_180 = 0;
        local_d0 = pMVar20;
        local_c8 = lVar21;
        local_a0 = uVar25;
        do {
          if (pMVar20->dims == 3) {
            lVar12 = (long)pMVar20->h * (long)pMVar20->w;
          }
          else {
            lVar12 = (long)pMVar20->h * (long)pMVar20->w * (long)pMVar20->d;
          }
          uVar24 = pMVar20->elemsize;
          if (0 < (int)local_128) {
            lVar22 = local_180 * local_c0;
            register0x00001248 =
                 *(undefined8 *)
                  (*(long *)(p_Var19 + 0xe0) +
                  (long)((int)*(float *)(*(long *)(p_Var19 + 0x128) + lVar21 + local_180 * 4) * 2) *
                  4);
            local_58 = 0x3f8000003f800000;
            local_b8 = pMVar20->data;
            sVar3 = pMVar20->cstep;
            pfVar23 = (float *)(sVar3 * lVar22 * uVar24 + (long)local_b8);
            local_110 = (float *)((lVar22 + 1) * sVar3 * uVar24 + (long)local_b8);
            local_118 = (float *)((lVar22 + 2) * sVar3 * uVar24 + (long)local_b8);
            local_120 = (float *)((lVar22 + 3) * sVar3 * uVar24 + (long)local_b8);
            pfVar17 = (float *)((lVar22 + 4) * sVar3 * uVar24 + (long)local_b8);
            local_b8 = (void *)((lVar22 + 5) * sVar3 * uVar24 + (long)local_b8);
            iVar11 = (int)((lVar12 * uVar24 + 0xf & 0xfffffffffffffff0) / uVar24);
            local_98 = (long)iVar11;
            uVar24 = 0;
            do {
              local_b0 = uVar24;
              if (0 < (int)uVar25) {
                local_48 = (float)(int)uVar24;
                local_a8 = (void *)((long)local_b8 + uVar24 * uVar25 * 4);
                fStack_40 = (float)local_88._0_4_;
                fStack_3c = (float)local_88._4_4_;
                uVar24 = 0;
                fStack_44 = local_48;
                do {
                  p_Var18 = this->_vptr_Yolov3DetectionOutput_x86[-3];
                  lVar21 = *(int *)(&this->field_0xd0 + (long)p_Var18) * local_98;
                  if ((int)lVar21 < 1) {
                    iVar10 = 0;
                    local_f8 = -3.4028235e+38;
                  }
                  else {
                    pfVar13 = (float *)((long)local_a8 + uVar24 * 4);
                    pfVar1 = pfVar13 + lVar21;
                    iVar10 = 0;
                    local_f8 = -3.4028235e+38;
                    iVar16 = 0;
                    do {
                      fVar26 = *pfVar13;
                      if (local_f8 < fVar26) {
                        iVar10 = iVar16;
                      }
                      if (local_f8 <= fVar26) {
                        local_f8 = fVar26;
                      }
                      pfVar13 = pfVar13 + iVar11;
                      iVar16 = iVar16 + 1;
                    } while (pfVar13 < pfVar1);
                  }
                  uStack_f4 = 0;
                  uStack_f0 = 0;
                  uStack_ec = 0;
                  local_90 = pfVar23;
                  local_138 = expf(-*pfVar17);
                  fVar26 = expf(-local_f8);
                  pfVar23 = local_90;
                  fVar26 = 1.0 / ((fVar26 + 1.0) * local_138 + 1.0);
                  if (*(float *)(&this->field_0xd8 + (long)p_Var18) <= fVar26) {
                    auVar34 = ZEXT416((uint)*local_110);
                    local_108 = -*local_90;
                    fStack_104 = -*local_110;
                    uStack_100 = 0x80000000;
                    uStack_fc = 0x80000000;
                    local_f8 = fVar26;
                    local_138 = expf(local_108);
                    fStack_134 = extraout_XMM0_Db;
                    fVar26 = expf(fStack_104);
                    local_138 = local_138 + 1.0;
                    fStack_130 = fStack_134 + 0.0;
                    fStack_12c = extraout_XMM0_Db_00 + 0.0;
                    fStack_134 = fVar26 + 1.0;
                    local_108 = expf(*local_118);
                    fVar26 = expf(*local_120);
                    local_178.score = local_f8;
                    auVar27._4_4_ = fStack_134;
                    auVar27._0_4_ = local_138;
                    auVar27._8_4_ = fStack_130;
                    auVar27._12_4_ = fStack_12c;
                    auVar27 = rcpps(auVar34,auVar27);
                    auVar33._0_4_ = (float)local_58._0_4_ * auVar27._0_4_;
                    auVar33._4_4_ = (float)local_58._4_4_ * auVar27._4_4_;
                    auVar33._8_4_ = fStack_50 * auVar27._8_4_;
                    auVar33._12_4_ = fStack_4c * auVar27._12_4_;
                    fVar28 = ((float)local_58._4_4_ - fStack_134 * auVar33._4_4_) * auVar27._4_4_ +
                             auVar33._4_4_;
                    auVar4._4_8_ = auVar27._8_8_;
                    auVar4._0_4_ = fStack_44;
                    auVar34._0_8_ = auVar4._0_8_ << 0x20;
                    auVar34._8_4_ = fStack_40;
                    auVar34._12_4_ = fStack_3c;
                    auVar30._4_12_ = auVar34._4_12_;
                    auVar30._0_4_ = (float)(int)uVar24;
                    auVar34 = rcpps(auVar33,auVar30);
                    fVar37 = fVar28 * auVar34._4_4_;
                    local_178.area = local_108 * fStack_50 * auVar34._8_4_;
                    fVar38 = fVar26 * fStack_4c * auVar34._12_4_;
                    local_178.area =
                         (local_108 * fStack_50 - fStack_40 * local_178.area) * auVar34._8_4_ +
                         local_178.area;
                    fVar38 = (fVar26 * fStack_4c - fStack_3c * fVar38) * auVar34._12_4_ + fVar38;
                    fVar26 = (((float)local_58._0_4_ - local_138 * auVar33._0_4_) * auVar27._0_4_ +
                              auVar33._0_4_ + auVar30._0_4_) * local_78;
                    fVar29 = (fVar28 + fStack_44) * fStack_74;
                    fVar31 = local_178.area * fStack_60;
                    fVar32 = fVar38 * fStack_5c;
                    auVar35._4_4_ = fVar32;
                    auVar35._0_4_ = fVar31;
                    auVar35._8_4_ = fVar26;
                    auVar35._12_4_ = fVar29;
                    local_178.xmin = fVar26 - fVar31;
                    local_178.ymin = fVar29 - fVar32;
                    auVar5._4_8_ = auVar35._8_8_;
                    auVar5._0_4_ = fVar32 + ((fVar28 - fStack_44 * fVar37) * auVar34._4_4_ + fVar37)
                                            * (float)local_68._4_4_;
                    auVar36._0_8_ = auVar5._0_8_ << 0x20;
                    auVar36._8_4_ = fVar26 + fVar31;
                    auVar36._12_4_ = fVar29 + fVar32;
                    local_178.area = local_178.area * fVar38;
                    this_00 = (vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                               *)(local_1a8.
                                  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_180);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    local_178.xmax = auVar36._8_4_;
                    local_178.ymax = auVar36._12_4_;
                    local_178.label = iVar10;
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::
                      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                                (this_00,__position,&local_178);
                    }
                    else {
                      (__position._M_current)->xmax = (float)(int)auVar36._8_8_;
                      (__position._M_current)->ymax = (float)(int)((ulong)auVar36._8_8_ >> 0x20);
                      (__position._M_current)->area = local_178.area;
                      (__position._M_current)->label = iVar10;
                      (__position._M_current)->score = local_f8;
                      (__position._M_current)->xmin = local_178.xmin;
                      (__position._M_current)->ymin = local_178.ymin;
                      (__position._M_current)->xmax = auVar36._8_4_;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x1c;
                    }
                  }
                  pfVar23 = pfVar23 + 1;
                  local_110 = local_110 + 1;
                  local_118 = local_118 + 1;
                  local_120 = local_120 + 1;
                  pfVar17 = pfVar17 + 1;
                  uVar24 = uVar24 + 1;
                  uVar25 = local_a0;
                } while (uVar24 != local_a0);
              }
              uVar24 = local_b0 + 1;
            } while (uVar24 != local_128);
            pp_Var15 = this->_vptr_Yolov3DetectionOutput_x86;
            pMVar20 = local_d0;
            lVar21 = local_c8;
          }
          local_180 = local_180 + 1;
          p_Var18 = pp_Var15[-3];
          p_Var19 = (_func_int *)((long)&this->_vptr_Yolov3DetectionOutput_x86 + (long)p_Var18);
        } while (local_180 < *(int *)(&this->field_0xd4 + (long)p_Var18));
      }
      if (0 < *(int *)(&this->field_0xd4 + (long)p_Var18)) {
        lVar21 = 8;
        lVar12 = 0;
        do {
          std::
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
          ::
          _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>>
                    ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      *)&local_158,
                     local_158.
                     super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     *(undefined8 *)
                      ((long)local_1a8.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar21 + -8),
                     *(undefined8 *)
                      ((long)&((local_1a8.
                                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar21));
          lVar12 = lVar12 + 1;
          lVar21 = lVar21 + 0x18;
        } while (lVar12 < *(int *)(&this->field_0xd4 +
                                  (long)this->_vptr_Yolov3DetectionOutput_x86[-3]));
      }
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector(&local_1a8);
      local_188 = local_188 + 1;
    } while (local_188 <
             (ulong)(((long)(local_d8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_d8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7));
  }
  Yolov3DetectionOutput::qsort_descent_inplace
            ((Yolov3DetectionOutput *)
             ((long)&this->_vptr_Yolov3DetectionOutput_x86 +
             (long)this->_vptr_Yolov3DetectionOutput_x86[-3]),&local_158);
  local_178.score = 0.0;
  local_178.xmin = 0.0;
  local_178.ymin = 0.0;
  local_178.xmax = 0.0;
  local_178.ymax = 0.0;
  local_178.area = 0.0;
  Yolov3DetectionOutput::nms_sorted_bboxes
            ((Yolov3DetectionOutput *)
             ((long)&this->_vptr_Yolov3DetectionOutput_x86 +
             (long)this->_vptr_Yolov3DetectionOutput_x86[-3]),&local_158,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_178,
             *(float *)(&this->field_0xdc + (long)this->_vptr_Yolov3DetectionOutput_x86[-3]));
  local_1a8.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar21 = CONCAT44(local_178.xmin,local_178.score);
  lVar12 = CONCAT44(local_178.xmax,local_178.ymin);
  if (lVar12 == lVar21) {
    iVar11 = 0;
  }
  else {
    uVar25 = 0;
    do {
      __args = local_158.
               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
               ._M_impl.super__Vector_impl_data._M_start + *(long *)(lVar21 + uVar25 * 8);
      if (local_1a8.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_1a8.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
        ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                  ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                    *)&local_1a8,
                   (iterator)
                   local_1a8.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__args);
        lVar21 = CONCAT44(local_178.xmin,local_178.score);
        lVar12 = CONCAT44(local_178.xmax,local_178.ymin);
      }
      else {
        uVar6 = *(undefined8 *)__args;
        uVar7 = *(undefined8 *)&__args->ymin;
        *(undefined1 (*) [16])
         ((long)local_1a8.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 0xc) =
             *(undefined1 (*) [16])&__args->xmax;
        *(undefined8 *)
         local_1a8.
         super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish = uVar6;
        *(undefined8 *)
         ((long)local_1a8.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) = uVar7;
        local_1a8.
        super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_1a8.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 0x1c);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 < (ulong)(lVar12 - lVar21 >> 3));
    _h = (int)((long)local_1a8.
                     super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1a8.
                     super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x49249249;
    iVar11 = 0;
    if (_h != 0) {
      this_01 = (local_e8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Mat::create(this_01,6,_h,4,local_e0->blob_allocator);
      iVar11 = -100;
      if (((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) &&
         (iVar11 = 0, 0 < (int)_h)) {
        iVar10 = this_01->w;
        sVar3 = this_01->elemsize;
        puVar14 = (undefined4 *)((long)this_01->data + 0x14);
        iVar11 = 0;
        lVar21 = 0;
        do {
          uVar2 = *(undefined4 *)
                   ((long)&((local_1a8.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                           )._M_impl.super__Vector_impl_data._M_start + lVar21);
          puVar14[-5] = (float)(*(int *)((long)&local_1a8.
                                                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[1].
                                                super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                                ._M_impl.super__Vector_impl_data._M_start + lVar21)
                               + 1);
          puVar14[-4] = uVar2;
          puVar14[-3] = *(undefined4 *)
                         ((long)&((local_1a8.
                                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar21 + 4);
          puVar14[-2] = *(undefined4 *)
                         ((long)&((local_1a8.
                                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + lVar21);
          puVar14[-1] = *(undefined4 *)
                         ((long)&((local_1a8.
                                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + lVar21 + 4);
          *puVar14 = *(undefined4 *)
                      ((long)&((local_1a8.
                                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar21);
          lVar21 = lVar21 + 0x1c;
          puVar14 = (undefined4 *)((long)puVar14 + (long)iVar10 * sVar3);
        } while ((ulong)(_h & 0x7fffffff) * 0x1c != lVar21);
      }
    }
  }
  if (local_1a8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.
                    super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a8.
                          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.
                          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar8 = (void *)CONCAT44(local_178.xmin,local_178.score);
  if (pvVar8 != (void *)0x0) {
    operator_delete(pvVar8,CONCAT44(local_178.area,local_178.ymax) - (long)pvVar8);
  }
LAB_002b7bb8:
  if (local_158.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar11;
}

Assistant:

int Yolov3DetectionOutput_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = scores.cstep;

#if __AVX__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + exp(-box_score_ptr[0]) * (1.f + exp(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}